

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int memdbOpen(sqlite3_vfs *pVfs,char *zName,sqlite3_file *pFd,int flags,int *pOutFlags)

{
  int iVar1;
  int iVar2;
  sqlite3_mutex *p_00;
  MemStore **ppMVar3;
  sqlite3_mutex *psVar4;
  long lVar5;
  MemStore **apNew;
  sqlite3_mutex *pVfsMutex;
  int i;
  int szName;
  MemStore *p;
  MemFile *pFile;
  int *pOutFlags_local;
  int flags_local;
  sqlite3_file *pFd_local;
  char *zName_local;
  sqlite3_vfs *pVfs_local;
  
  _i = (sqlite3_io_methods *)0x0;
  memset(pFd,0,0x18);
  iVar1 = sqlite3Strlen30(zName);
  if ((iVar1 < 2) || (*zName != '/')) {
    _i = (sqlite3_io_methods *)sqlite3Malloc(0x48);
    if (_i == (sqlite3_io_methods *)0x0) {
      return 7;
    }
    memset(_i,0,0x48);
    *(undefined4 *)((long)&_i->xSync + 4) = 3;
    _i->xRead = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)sqlite3Config.mxMemdbSize;
  }
  else {
    p_00 = sqlite3MutexAlloc(0xb);
    sqlite3_mutex_enter(p_00);
    for (pVfsMutex._0_4_ = 0; (int)pVfsMutex < memdb_g.nMemStore;
        pVfsMutex._0_4_ = (int)pVfsMutex + 1) {
      iVar2 = strcmp(memdb_g.apMemStore[(int)pVfsMutex]->zFName,zName);
      if (iVar2 == 0) {
        _i = (sqlite3_io_methods *)memdb_g.apMemStore[(int)pVfsMutex];
        break;
      }
    }
    if (_i == (sqlite3_io_methods *)0x0) {
      _i = (sqlite3_io_methods *)sqlite3Malloc((long)iVar1 + 0x4b);
      if (_i == (sqlite3_io_methods *)0x0) {
        sqlite3_mutex_leave(p_00);
        return 7;
      }
      ppMVar3 = (MemStore **)sqlite3Realloc(memdb_g.apMemStore,(long)(memdb_g.nMemStore + 1) << 3);
      if (ppMVar3 == (MemStore **)0x0) {
        sqlite3_free(_i);
        sqlite3_mutex_leave(p_00);
        return 7;
      }
      lVar5 = (long)memdb_g.nMemStore;
      memdb_g.nMemStore = memdb_g.nMemStore + 1;
      ppMVar3[lVar5] = (MemStore *)_i;
      memdb_g.apMemStore = ppMVar3;
      memset(_i,0,0x48);
      *(uint *)((long)&_i->xSync + 4) = 3;
      _i->xRead = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)sqlite3Config.mxMemdbSize
      ;
      _i->xUnlock = (_func_int_sqlite3_file_ptr_int *)&_i->xCheckReservedLock;
      memcpy(_i->xUnlock,zName,(long)(iVar1 + 1));
      psVar4 = sqlite3_mutex_alloc(0);
      _i->xTruncate = (_func_int_sqlite3_file_ptr_sqlite3_int64 *)psVar4;
      if ((sqlite3_mutex *)_i->xTruncate == (sqlite3_mutex *)0x0) {
        memdb_g.nMemStore = memdb_g.nMemStore + -1;
        sqlite3_free(_i);
        sqlite3_mutex_leave(p_00);
        return 7;
      }
      *(int *)&_i->xLock = 1;
      memdbEnter((MemStore *)_i);
    }
    else {
      memdbEnter((MemStore *)_i);
      *(int *)&_i->xLock = *(int *)&_i->xLock + 1;
    }
    sqlite3_mutex_leave(p_00);
  }
  pFd[1].pMethods = _i;
  if (pOutFlags != (int *)0x0) {
    *pOutFlags = flags | 0x80;
  }
  pFd->pMethods = &memdb_io_methods;
  memdbLeave((MemStore *)_i);
  return 0;
}

Assistant:

static int memdbOpen(
  sqlite3_vfs *pVfs,
  const char *zName,
  sqlite3_file *pFd,
  int flags,
  int *pOutFlags
){
  MemFile *pFile = (MemFile*)pFd;
  MemStore *p = 0;
  int szName;
  UNUSED_PARAMETER(pVfs);

  memset(pFile, 0, sizeof(*pFile));
  szName = sqlite3Strlen30(zName);
  if( szName>1 && zName[0]=='/' ){
    int i;
#ifndef SQLITE_MUTEX_OMIT
    sqlite3_mutex *pVfsMutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_VFS1);
#endif
    sqlite3_mutex_enter(pVfsMutex);
    for(i=0; i<memdb_g.nMemStore; i++){
      if( strcmp(memdb_g.apMemStore[i]->zFName,zName)==0 ){
        p = memdb_g.apMemStore[i];
        break;
      }
    }
    if( p==0 ){
      MemStore **apNew;
      p = sqlite3Malloc( sizeof(*p) + szName + 3 );
      if( p==0 ){
        sqlite3_mutex_leave(pVfsMutex);
        return SQLITE_NOMEM;
      }
      apNew = sqlite3Realloc(memdb_g.apMemStore,
                             sizeof(apNew[0])*(memdb_g.nMemStore+1) );
      if( apNew==0 ){
        sqlite3_free(p);
        sqlite3_mutex_leave(pVfsMutex);
        return SQLITE_NOMEM;
      }
      apNew[memdb_g.nMemStore++] = p;
      memdb_g.apMemStore = apNew;
      memset(p, 0, sizeof(*p));
      p->mFlags = SQLITE_DESERIALIZE_RESIZEABLE|SQLITE_DESERIALIZE_FREEONCLOSE;
      p->szMax = sqlite3GlobalConfig.mxMemdbSize;
      p->zFName = (char*)&p[1];
      memcpy(p->zFName, zName, szName+1);
      p->pMutex = sqlite3_mutex_alloc(SQLITE_MUTEX_FAST);
      if( p->pMutex==0 ){
        memdb_g.nMemStore--;
        sqlite3_free(p);
        sqlite3_mutex_leave(pVfsMutex);
        return SQLITE_NOMEM;
      }
      p->nRef = 1;
      memdbEnter(p);
    }else{
      memdbEnter(p);
      p->nRef++;
    }
    sqlite3_mutex_leave(pVfsMutex);
  }else{
    p = sqlite3Malloc( sizeof(*p) );
    if( p==0 ){
      return SQLITE_NOMEM;
    }
    memset(p, 0, sizeof(*p));
    p->mFlags = SQLITE_DESERIALIZE_RESIZEABLE | SQLITE_DESERIALIZE_FREEONCLOSE;
    p->szMax = sqlite3GlobalConfig.mxMemdbSize;
  }
  pFile->pStore = p;
  if( pOutFlags!=0 ){
    *pOutFlags = flags | SQLITE_OPEN_MEMORY;
  }
  pFd->pMethods = &memdb_io_methods;
  memdbLeave(p);
  return SQLITE_OK;
}